

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall
slang::parsing::Parser::parseModportSubroutinePortList(Parser *this,AttrList attributes)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  FunctionPrototypeSyntax *prototype;
  ModportSubroutinePortSyntax *pMVar3;
  ModportNamedPortSyntax *pMVar4;
  undefined4 extraout_var;
  ModportSubroutinePortListSyntax *pMVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *src;
  Token TVar6;
  Token importExport;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_188;
  uint local_178;
  size_type local_170;
  pointer local_168;
  size_type local_160;
  Info *local_158;
  undefined8 local_150;
  pointer local_148;
  size_type local_140;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> local_60;
  
  local_140 = attributes.size_;
  local_148 = attributes.data_;
  TVar6 = ParserBase::consume(&this->super_ParserBase);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  this_00 = &this->factory;
  do {
    local_158 = TVar6.info;
    local_150 = TVar6._0_8_;
    bVar1 = ParserBase::peek(&this->super_ParserBase,FunctionKeyword);
    if (bVar1) {
LAB_002ba2fe:
      prototype = parseFunctionPrototype
                            (this,Unknown,(bitmask<slang::parsing::detail::FunctionOptions>)0xb,
                             (bool *)0x0);
      pMVar3 = slang::syntax::SyntaxFactory::modportSubroutinePort(this_00,prototype);
      local_188._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar3;
      local_178 = CONCAT31(local_178._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_188._M_first);
    }
    else {
      bVar1 = ParserBase::peek(&this->super_ParserBase,TaskKeyword);
      if (bVar1) goto LAB_002ba2fe;
      TVar6 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pMVar4 = slang::syntax::SyntaxFactory::modportNamedPort(this_00,TVar6);
      local_188._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar4;
      local_178 = CONCAT31(local_178._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_188._M_first);
      src = extraout_RDX;
      if ((TVar6._0_4_ >> 0x10 & 1) != 0) {
LAB_002ba3c7:
        local_178 = 1;
        local_170 = local_140;
        local_168 = local_148;
        local_160 = local_140;
        local_188 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
                    ZEXT816(0x4703a8);
        iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
        local_60.elements.data_ = (pointer)CONCAT44(extraout_var,iVar2);
        local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_60.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
        local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00473740;
        importExport.info = local_158;
        importExport.kind = (undefined2)local_150;
        importExport._2_1_ = local_150._2_1_;
        importExport.numFlags.raw = local_150._3_1_;
        importExport.rawLen = local_150._4_4_;
        pMVar5 = slang::syntax::SyntaxFactory::modportSubroutinePortList
                           (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                    &local_188._M_first,importExport,&local_60);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
        return &pMVar5->super_MemberSyntax;
      }
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
    src = extraout_RDX_00;
    if (!bVar1) goto LAB_002ba3c7;
    TVar6 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar6.kind != FunctionKeyword) {
      TVar6 = ParserBase::peek(&this->super_ParserBase,1);
      if (TVar6.kind != TaskKeyword) {
        TVar6 = ParserBase::peek(&this->super_ParserBase,1);
        src = TVar6.info;
        if (TVar6.kind != Identifier) goto LAB_002ba3c7;
      }
    }
    local_188._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_178 = local_178 & 0xffffff00;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
               (TokenOrSyntax *)&local_188._M_first);
    TVar6.info = local_158;
    TVar6.kind = (undefined2)local_150;
    TVar6._2_1_ = local_150._2_1_;
    TVar6.numFlags.raw = local_150._3_1_;
    TVar6.rawLen = local_150._4_4_;
  } while( true );
}

Assistant:

MemberSyntax& Parser::parseModportSubroutinePortList(AttrList attributes) {
    auto importExport = consume();

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        if (peek(TokenKind::FunctionKeyword) || peek(TokenKind::TaskKeyword)) {
            auto& proto = parseFunctionPrototype(SyntaxKind::Unknown,
                                                 FunctionOptions::AllowEmptyArgNames |
                                                     FunctionOptions::AllowTasks |
                                                     FunctionOptions::IsPrototype);
            buffer.push_back(&factory.modportSubroutinePort(proto));
        }
        else {
            auto name = expect(TokenKind::Identifier);
            buffer.push_back(&factory.modportNamedPort(name));
            if (name.isMissing())
                break;
        }

        if (!peek(TokenKind::Comma) ||
            (peek(1).kind != TokenKind::FunctionKeyword && peek(1).kind != TokenKind::TaskKeyword &&
             peek(1).kind != TokenKind::Identifier)) {
            break;
        }

        buffer.push_back(consume());
    }

    return factory.modportSubroutinePortList(attributes, importExport, buffer.copy(alloc));
}